

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_upscaleStat(uint *table,U32 lastEltIndex,int bonus)

{
  U32 local_20;
  uint local_1c;
  U32 sum;
  U32 s;
  int bonus_local;
  U32 lastEltIndex_local;
  uint *table_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < lastEltIndex + 1; local_1c = local_1c + 1) {
    table[local_1c] = table[local_1c] << ((char)bonus + 4U & 0x1f);
    table[local_1c] = table[local_1c] - 1;
    local_20 = table[local_1c] + local_20;
  }
  return local_20;
}

Assistant:

static U32 ZSTD_upscaleStat(unsigned* table, U32 lastEltIndex, int bonus)
{
    U32 s, sum=0;
    assert(ZSTD_FREQ_DIV+bonus >= 0);
    for (s=0; s<lastEltIndex+1; s++) {
        table[s] <<= ZSTD_FREQ_DIV+bonus;
        table[s]--;
        sum += table[s];
    }
    return sum;
}